

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O3

QString * QMakeInternal::IoUtils::shellQuoteUnix(QString *__return_storage_ptr__,QString *arg)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  char16_t *pcVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  
  lVar6 = (arg->d).size;
  if (lVar6 == 0) {
    QVar8.m_data = (storage_type *)0x2;
    QVar8.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar8);
  }
  else {
    pDVar2 = (arg->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    pcVar4 = (arg->d).ptr;
    (__return_storage_ptr__->d).ptr = pcVar4;
    (__return_storage_ptr__->d).size = lVar6;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pcVar4 = (__return_storage_ptr__->d).ptr;
      lVar6 = (__return_storage_ptr__->d).size;
    }
    uVar5 = (int)lVar6 - 1;
    if (-1 < (int)uVar5) {
      if (pcVar4 == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      lVar6 = (ulong)uVar5 + 1;
      do {
        cVar1 = pcVar4[lVar6 + -1];
        if (((ushort)cVar1 < 0x80) &&
           ((shellQuoteUnix::iqm[(ushort)cVar1 >> 3] >> (cVar1 & 7U) & 1) != 0)) {
          QVar9.m_data = (char *)0x4;
          QVar9.m_size = 0x27;
          QString::replace((QChar)(char16_t)__return_storage_ptr__,QVar9,0x2b5d50);
          QString::insert((longlong)__return_storage_ptr__,(QChar)0x0);
          QString::append((QChar)(char16_t)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        lVar7 = lVar6 + -1;
        bVar3 = 0 < lVar6;
        lVar6 = lVar7;
      } while (lVar7 != 0 && bVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString IoUtils::shellQuoteUnix(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0xdf, 0x07, 0x00, 0xd8,
        0x00, 0x00, 0x00, 0x38, 0x01, 0x00, 0x00, 0x78
    }; // 0-32 \'"$`<>|;&(){}*?#!~[]

    if (!arg.size())
        return QString::fromLatin1("''");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        ret.replace(QLatin1Char('\''), QLatin1String("'\\''"));
        ret.prepend(QLatin1Char('\''));
        ret.append(QLatin1Char('\''));
    }
    return ret;
}